

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data.cc
# Opt level: O3

bool __thiscall
bssl::ParsePublicKey(bssl *this,Input public_key_spki,UniquePtr<EVP_PKEY> *public_key)

{
  EVP_PKEY *__p;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *this_00;
  bool bVar1;
  bool bVar2;
  CBS cbs;
  CBS local_20;
  
  this_00 = (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)public_key_spki.data_.size_;
  local_20.len = (size_t)public_key_spki.data_.data_;
  local_20.data = (uint8_t *)this;
  __p = EVP_parse_public_key(&local_20);
  ::std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset(this_00,__p);
  bVar1 = (this_00->_M_t).super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl != (evp_pkey_st *)0x0;
  bVar2 = (uchar *)local_20.len == (uchar *)0x0;
  if (!bVar2 || !bVar1) {
    ::std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset(this_00,(pointer)0x0);
  }
  ERR_clear_error();
  return bVar2 && bVar1;
}

Assistant:

bool ParsePublicKey(der::Input public_key_spki,
                    bssl::UniquePtr<EVP_PKEY> *public_key) {
  // Parse the SPKI to an EVP_PKEY.
  OpenSSLErrStackTracer err_tracer;

  CBS cbs;
  CBS_init(&cbs, public_key_spki.data(), public_key_spki.size());
  public_key->reset(EVP_parse_public_key(&cbs));
  if (!*public_key || CBS_len(&cbs) != 0) {
    public_key->reset();
    return false;
  }
  return true;
}